

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

TcParseTableBase *
google::protobuf::internal::TcParser::GetTableFromAux(uint16_t type_card,FieldAux aux)

{
  TcParseTableBase *pTVar1;
  LogMessageFatal LStack_18;
  
  switch(type_card >> 9 & 3) {
  case 0:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              (&LStack_18,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
               ,0x9c8,"tv == field_layout::kTvDefault || tv == field_layout::kTvWeakPtr");
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_18);
  case 2:
    return (TcParseTableBase *)aux.message_default_p;
  case 3:
    aux = *aux.message_default_p;
  }
  pTVar1 = MessageLite::GetTcParseTable(aux.table);
  return pTVar1;
}

Assistant:

inline const TcParseTableBase* TcParser::GetTableFromAux(
    uint16_t type_card, TcParseTableBase::FieldAux aux) {
  uint16_t tv = type_card & field_layout::kTvMask;
  if (ABSL_PREDICT_TRUE(tv == field_layout::kTvTable)) {
    return aux.table;
  }
  ABSL_DCHECK(tv == field_layout::kTvDefault || tv == field_layout::kTvWeakPtr);
  const MessageLite* prototype = tv == field_layout::kTvDefault
                                     ? aux.message_default()
                                     : aux.message_default_weak();
  return prototype->GetTcParseTable();
}